

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void PPrintEndTag(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  ulong in_RAX;
  TidyPrintImpl *pprint;
  undefined4 in_register_00000034;
  byte *str;
  tchar c;
  undefined8 uStack_28;
  
  iVar1 = *(int *)((doc->config).value + 0x54);
  pprint = &doc->pprint;
  str = *(byte **)(CONCAT44(in_register_00000034,mode) + 0x40);
  uStack_28 = in_RAX;
  AddString(pprint,"</");
  if ((str != (byte *)0x0) && (bVar2 = *str, bVar2 != 0)) {
    do {
      uStack_28 = (ulong)CONCAT14(bVar2,(undefined4)uStack_28);
      if ((char)bVar2 < '\0') {
        uVar3 = prvTidyGetUTF8((ctmbstr)str,(uint *)((long)&uStack_28 + 4));
        str = str + uVar3;
      }
      else if (iVar1 != 0) {
        uVar3 = prvTidyToUpper((uint)bVar2);
        uStack_28 = CONCAT44(uVar3,(undefined4)uStack_28);
      }
      AddChar(pprint,uStack_28._4_4_);
      bVar2 = str[1];
      str = str + 1;
    } while (bVar2 != 0);
  }
  AddChar(pprint,0x3e);
  return;
}

Assistant:

static void PPrintEndTag( TidyDocImpl* doc, uint ARG_UNUSED(mode),
                          uint ARG_UNUSED(indent), Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool uc = cfgBool( doc, TidyUpperCaseTags );
    tmbstr s = node->element;
    tchar c;

    AddString( pprint, "</" );

    if (s)
    {
        while (*s)
        {
             c = (unsigned char)*s;

             if (c > 0x7F)
                 s += TY_(GetUTF8)(s, &c);
             else if (uc)
                 c = TY_(ToUpper)(c);

             AddChar(pprint, c);
             ++s;
        }
    }

    AddChar( pprint, '>' );
}